

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[12]>
          (char (*args) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [12])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char (*in_stack_ffffffffffffffa8) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  char *in_stack_ffffffffffffffc0;
  
  rest = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  out = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        concat_length<std::__cxx11::string,char[12]>
                  (in_stack_ffffffffffffffc0,rest,(char (*) [12])in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[12],_0>
            (out,(char (*) [6])rest,in_RDI,in_stack_ffffffffffffffa8);
  return rest;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}